

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

short __thiscall
xercesc_4_0::DOMNodeImpl::reverseTreeOrderBitPattern(DOMNodeImpl *this,short pattern)

{
  undefined2 local_12;
  short pattern_local;
  DOMNodeImpl *this_local;
  
  if ((pattern & 2U) == 0) {
    local_12 = pattern;
    if ((pattern & 4U) != 0) {
      local_12 = pattern & 0xfffbU | 2;
    }
  }
  else {
    local_12 = pattern & 0xfffdU | 4;
  }
  if ((local_12 & 0x10) == 0) {
    if ((local_12 & 8) != 0) {
      local_12 = local_12 & 0xfff7 | 0x10;
    }
  }
  else {
    local_12 = local_12 & 0xffef | 8;
  }
  return local_12;
}

Assistant:

short DOMNodeImpl::reverseTreeOrderBitPattern(short pattern) const {

    if(pattern & DOMNode::DOCUMENT_POSITION_PRECEDING) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_PRECEDING;
        pattern |= DOMNode::DOCUMENT_POSITION_FOLLOWING;
    }
    else if(pattern & DOMNode::DOCUMENT_POSITION_FOLLOWING) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_FOLLOWING;
        pattern |= DOMNode::DOCUMENT_POSITION_PRECEDING;
    }

    if(pattern & DOMNode::DOCUMENT_POSITION_CONTAINED_BY) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_CONTAINED_BY;
        pattern |= DOMNode::DOCUMENT_POSITION_CONTAINS;
    }
    else if(pattern & DOMNode::DOCUMENT_POSITION_CONTAINS) {
        pattern &= ~DOMNode::DOCUMENT_POSITION_CONTAINS;
        pattern |= DOMNode::DOCUMENT_POSITION_CONTAINED_BY;
    }

    return pattern;
}